

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O0

void __thiscall
ot::commissioner::JoinerSession::RelaySocket::RelaySocket(RelaySocket *this,RelaySocket *aOther)

{
  RelaySocket *aOther_local;
  RelaySocket *this_local;
  
  Socket::Socket(&this->super_Socket,&aOther->super_Socket);
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RelaySocket_003ef520;
  this->mJoinerSession = aOther->mJoinerSession;
  Address::Address(&this->mPeerAddr,&aOther->mPeerAddr);
  this->mPeerPort = aOther->mPeerPort;
  Address::Address(&this->mLocalAddr,&aOther->mLocalAddr);
  this->mLocalPort = aOther->mLocalPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->mRecvBuf);
  return;
}

Assistant:

JoinerSession::RelaySocket::RelaySocket(RelaySocket &&aOther)
    : Socket(std::move(static_cast<Socket &&>(aOther)))
    , mJoinerSession(aOther.mJoinerSession)
    , mPeerAddr(std::move(aOther.mPeerAddr))
    , mPeerPort(std::move(aOther.mPeerPort))
    , mLocalAddr(aOther.mLocalAddr)
    , mLocalPort(aOther.mLocalPort)
{
}